

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_ARB1_LABEL(Context *ctx)

{
  RegisterList *pRVar1;
  size_t in_RCX;
  char labelstr [64];
  
  if (ctx->profile_supports_nv2 != 0) {
    pRVar1 = reglist_find(&ctx->used_registers,REG_TYPE_LABEL,ctx->source_args[0].regnum);
    if (pRVar1 == (RegisterList *)0x0) {
      set_output(ctx,&ctx->ignore);
    }
    get_ARB1_srcarg_varname(ctx,0,labelstr,in_RCX);
    output_line(ctx,"%s:",labelstr);
  }
  return;
}

Assistant:

EMIT_ARB1_OPCODE_UNIMPLEMENTED_FUNC(ENDLOOP)

static void emit_ARB1_LABEL(Context *ctx)
{
    if (!support_nv2(ctx))  // no branching in stock ARB1.
        return;  // don't fail()...maybe we never use it, but do fail in CALL.

    const int label = ctx->source_args[0].regnum;
    RegisterList *reg = reglist_find(&ctx->used_registers, REG_TYPE_LABEL, label);

    // MSDN specs say CALL* has to come before the LABEL, so we know if we
    //  can ditch the entire function here as unused.
    if (reg == NULL)
        set_output(ctx, &ctx->ignore);  // Func not used. Parse, but don't output.

    // !!! FIXME: it would be nice if we could determine if a function is
    // !!! FIXME:  only called once and, if so, forcibly inline it.

    //const char *uses_loopreg = ((reg) && (reg->misc == 1)) ? "int aL" : "";
    char labelstr[64];
    get_ARB1_srcarg_varname(ctx, 0, labelstr, sizeof (labelstr));
    output_line(ctx, "%s:", labelstr);
}